

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FragmentShader.hpp
# Opt level: O1

Vector3<double> *
eos::render::compute_inverse_perspectively_correct_lambda<double>
          (Vector3<double> *__return_storage_ptr__,Vector3<double> *lambda_world,double *one_over_w0
          ,double *one_over_w1,double *one_over_w2)

{
  double dVar1;
  Vector3<double> *lambda;
  double dVar2;
  double dVar3;
  float fVar4;
  
  fVar4 = (float)(1.0 / *one_over_w0);
  dVar3 = *one_over_w1;
  dVar1 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[1];
  dVar2 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
          m_data.array[2];
  fVar4 = (float)(((double)fVar4 - (double)(fVar4 - (float)(1.0 / dVar3)) * dVar1) -
                 (double)(fVar4 - (float)(1.0 / *one_over_w2)) * dVar2);
  if ((fVar4 == 0.0) && (!NAN(fVar4))) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[2] =
         (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[2];
    dVar3 = (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
            m_data.array[1];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[0] =
         (lambda_world->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
         m_data.array[0];
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage
    .m_data.array[1] = dVar3;
    return __return_storage_ptr__;
  }
  dVar2 = (dVar2 * (double)(float)(1.0 / *one_over_w2)) / (double)fVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[2] = dVar2;
  dVar3 = (dVar1 * (double)(float)(1.0 / dVar3)) / (double)fVar4;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[1] = dVar3;
  (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>).m_storage.
  m_data.array[0] = (1.0 - dVar3) - dVar2;
  return __return_storage_ptr__;
}

Assistant:

Eigen::Vector3<T> compute_inverse_perspectively_correct_lambda(const Eigen::Vector3<T>& lambda_world,
                                                               const T& one_over_w0, const T& one_over_w1,
                                                               const T& one_over_w2)
{
    const float w0 = 1 / one_over_w0;
    const float w1 = 1 / one_over_w1;
    const float w2 = 1 / one_over_w2;

    const float d = w0 - (w0 - w1) * lambda_world.y() - (w0 - w2) * lambda_world.z();
    if (d == 0)
        return lambda_world;

    Eigen::Vector3<T> lambda;

    lambda.z() = lambda_world.z() * w2 / d;
    lambda.y() = lambda_world.y() * w1 / d;

    lambda.x() = 1 - lambda.y() - lambda.z();
    return lambda;
}